

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O0

char * raviX_get_type_name(ravitype_t tt)

{
  char *pcStack_10;
  ravitype_t tt_local;
  
  if (tt == RAVI_TANY) {
    pcStack_10 = "any";
  }
  else if (tt == RAVI_TNIL) {
    pcStack_10 = "nil";
  }
  else if (tt == RAVI_TBOOLEAN) {
    pcStack_10 = "boolean";
  }
  else if (tt == RAVI_TNUMINT) {
    pcStack_10 = "integer";
  }
  else if (tt == RAVI_TNUMFLT) {
    pcStack_10 = "number";
  }
  else if (tt == RAVI_TARRAYINT) {
    pcStack_10 = "integer[]";
  }
  else if (tt == RAVI_TARRAYFLT) {
    pcStack_10 = "number[]";
  }
  else if (tt == RAVI_TTABLE) {
    pcStack_10 = "table";
  }
  else if (tt == RAVI_TSTRING) {
    pcStack_10 = "string";
  }
  else if (tt == RAVI_TFUNCTION) {
    pcStack_10 = "closure";
  }
  else if (tt == RAVI_TUSERDATA) {
    pcStack_10 = "userdata";
  }
  else {
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char *raviX_get_type_name(ravitype_t tt)
{
	switch (tt) {
	case RAVI_TANY:
		return "any";
	case RAVI_TNIL:
		return "nil";
	case RAVI_TBOOLEAN:
		return "boolean";
	case RAVI_TNUMFLT:
		return "number";
	case RAVI_TNUMINT:
		return "integer";
	case RAVI_TTABLE:
		return "table";
	case RAVI_TSTRING:
		return "string";
	case RAVI_TARRAYINT:
		return "integer[]";
	case RAVI_TARRAYFLT:
		return "number[]";
	case RAVI_TFUNCTION:
		return "closure";
	case RAVI_TUSERDATA:
		return "userdata";
	default:
		return "?";
	}
}